

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CropFace.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *__s;
  allocator<char> local_191;
  String local_190;
  string local_170 [32];
  String output_path;
  Mat image;
  long local_120;
  Mat local_d0 [96];
  string local_70 [96];
  
  if (argc != 2) {
    puts("usage: CropFace <Image_Path>");
    return -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_path,argv[1],(allocator<char> *)&image);
  std::__cxx11::string::append((char *)&output_path);
  cv::Mat::Mat(&image);
  std::__cxx11::string::string<std::allocator<char>>(local_170,argv[1],&local_191);
  cv::imread(local_70,(int)local_170);
  cv::Mat::operator=(&image,(Mat *)local_70);
  cv::Mat::~Mat((Mat *)local_70);
  std::__cxx11::string::~string(local_170);
  if (local_120 == 0) {
    __s = "No image data ";
  }
  else {
    cVar1 = cv::CascadeClassifier::load((string *)cascade);
    if (cVar1 != '\0') {
      cv::Mat::Mat(local_d0,&image);
      std::__cxx11::string::string((string *)&local_190,(string *)&output_path);
      detectAndSave(local_d0,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      cv::Mat::~Mat(local_d0);
      iVar2 = 0;
      goto LAB_00102498;
    }
    __s = "--(!)Error loading face cascade";
  }
  puts(__s);
  iVar2 = -1;
LAB_00102498:
  cv::Mat::~Mat(&image);
  std::__cxx11::string::~string((string *)&output_path);
  return iVar2;
}

Assistant:

int main(int argc, char** argv ){
    if ( argc != 2 ){
        printf("usage: CropFace <Image_Path>\n");
        return -1;
    }
    String output_path = argv[1];
    output_path += "_face.jpg";

    Mat image;
    image = imread( argv[1], 1 );

    if ( !image.data ){
        printf("No image data \n");
        return -1;
    }

    // load cascades
    if( !cascade.load( face_cascade_name ) ){ printf("--(!)Error loading face cascade\n"); return -1; };
    detectAndSave( image, output_path );

    return 0;
}